

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool Data649::loadArchive(char *fname,Issues *issues)

{
  value_type vVar1;
  byte bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  undefined8 in_RDI;
  Draw draw;
  int i;
  int ndraws;
  Issue issue;
  int n;
  int a;
  istringstream iss;
  vector<int,_std::allocator<int>_> arr;
  string line;
  int curIssueId;
  ifstream fin;
  size_type in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  value_type vVar6;
  value_type in_stack_fffffffffffffb78;
  value_type in_stack_fffffffffffffb7c;
  value_type in_stack_fffffffffffffb80;
  value_type in_stack_fffffffffffffb84;
  Draw local_444;
  int local_428;
  int local_424;
  int local_420;
  value_type local_41c;
  value_type local_418;
  int local_3f8;
  int local_3f4;
  istringstream local_3f0 [384];
  vector<int,_std::allocator<int>_> local_270;
  string local_258 [36];
  int local_234;
  int local_230;
  istream local_220 [528];
  undefined8 local_10;
  byte local_1;
  
  local_10 = in_RDI;
  std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::clear
            ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)0x102414);
  std::ifstream::ifstream(local_220,local_10,8);
  bVar2 = std::ios::good();
  if ((bVar2 & 1) == 0) {
    local_1 = 0;
    local_230 = 1;
  }
  else {
    local_234 = 0;
    while( true ) {
      std::__cxx11::string::string(local_258);
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_258);
      bVar2 = std::ios::eof();
      if ((bVar2 & 1) == 0) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x10251a);
        std::__cxx11::istringstream::istringstream(local_3f0,local_258,8);
        while (bVar2 = std::ios::eof(), (bVar2 & 1) == 0) {
          std::istream::operator>>((istream *)local_3f0,&local_3f4);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        }
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_270);
        local_3f8 = (int)sVar3;
        if ((((local_3f8 == 8) || (local_3f8 == 0xe)) || (local_3f8 == 0x14)) || (local_3f8 == 0x1a)
           ) {
          Issue::Issue((Issue *)0x102647);
          local_420 = local_234;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_270,0);
          local_418 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_270,1);
          local_41c = *pvVar4;
          local_424 = (local_3f8 + -2) / 6;
          for (local_428 = 0; local_428 < local_424; local_428 = local_428 + 1) {
            Draw::Draw(&local_444);
            local_444.id = local_428;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 2));
            vVar6 = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = vVar6;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 3));
            in_stack_fffffffffffffb78 = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = in_stack_fffffffffffffb78;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 4));
            in_stack_fffffffffffffb7c = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = in_stack_fffffffffffffb7c;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 5));
            in_stack_fffffffffffffb80 = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = in_stack_fffffffffffffb80;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 6));
            in_stack_fffffffffffffb84 = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = in_stack_fffffffffffffb84;
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&local_270,(long)(local_428 * 6 + 7));
            vVar1 = *pvVar4;
            pvVar5 = std::array<int,_6UL>::operator[]
                               ((array<int,_6UL> *)CONCAT44(vVar6,in_stack_fffffffffffffb70),
                                in_stack_fffffffffffffb68);
            *pvVar5 = vVar1;
            std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::emplace_back<Data649::Draw>
                      ((vector<Data649::Draw,_std::allocator<Data649::Draw>_> *)
                       CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                       (Draw *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          }
          std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::emplace_back<Data649::Issue>
                    ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)
                     CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                     (Issue *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
          local_234 = local_234 + 1;
          Issue::~Issue((Issue *)0x102895);
          local_230 = 0;
        }
        else {
          fprintf(_stderr,"Unexpected number of integers in archive line: %d\n",sVar3 & 0xffffffff);
          local_1 = 0;
          local_230 = 1;
        }
        std::__cxx11::istringstream::~istringstream(local_3f0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
      }
      else {
        local_230 = 3;
      }
      std::__cxx11::string::~string(local_258);
      if (local_230 != 0) break;
      in_stack_fffffffffffffb70 = 0;
    }
    if (local_230 == 3) {
      std::ifstream::close();
      local_1 = 1;
      local_230 = 1;
    }
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool loadArchive(const char * fname, Issues & issues) {
    issues.clear();

    std::ifstream fin(fname);
    if (!fin.good()) return false;

    int curIssueId = 0;

    while (true) {
        std::string line;
        std::getline(fin, line);
        if (fin.eof()) break;

        std::vector<int> arr;
        std::istringstream iss(line);
        while (true) {
            int a;
            if (iss.eof()) break;
            iss >> a;
            arr.push_back(a);
        }

        int n = arr.size();
        if (n != 8 && n != 14 && n != 20 && n != 26) {
            fprintf(stderr, "Unexpected number of integers in archive line: %d\n", n);
            return false;
        }

        Issue issue;
        issue.id = curIssueId;
        issue.year = arr[0];
        issue.idYear = arr[1];

        int ndraws = (n - 2)/6;
        for (int i = 0; i < ndraws; ++i) {
            Draw draw;
            draw.id = i;
            draw.nums[0] = arr[2 + i*6 + 0];
            draw.nums[1] = arr[2 + i*6 + 1];
            draw.nums[2] = arr[2 + i*6 + 2];
            draw.nums[3] = arr[2 + i*6 + 3];
            draw.nums[4] = arr[2 + i*6 + 4];
            draw.nums[5] = arr[2 + i*6 + 5];

            issue.draws.emplace_back(std::move(draw));
        }

        issues.emplace_back(std::move(issue));

        ++curIssueId;
    }

    fin.close();

    return true;
}